

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

void FIX::socket_setnonblock(socket_handle socket)

{
  socket_setfcntlflag(socket,0x800);
  return;
}

Assistant:

void socket_setnonblock(socket_handle socket )
{
#ifdef _MSC_VER
  u_long opt = 1;
  ::ioctlsocket( socket, FIONBIO, &opt );
#else
  socket_setfcntlflag( socket, O_NONBLOCK );
#endif
}